

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O2

void initHashMap(Mesh *mesh,VectorXd *x,double epsilon)

{
  double *pdVar1;
  bool bVar2;
  int i;
  long lVar3;
  BaseHandle _vh;
  undefined8 local_40;
  BaseHandle local_38;
  
  std::
  _Hashtable<OpenMesh::VectorT<int,_2>,_std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_std::allocator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>,_std::__detail::_Select1st,_std::equal_to<OpenMesh::VectorT<int,_2>_>,_myHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::clear(&neighbors._M_h);
  _vh.idx_ = 0;
  for (lVar3 = 0;
      lVar3 < (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      lVar3 = lVar3 + 2) {
    bVar2 = OpenMesh::PolyConnectivity::is_boundary((PolyConnectivity *)mesh,(VertexHandle)_vh.idx_)
    ;
    if (bVar2) {
      pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      local_40 = CONCAT44((int)(pdVar1[lVar3 + 1] / epsilon),(int)(pdVar1[lVar3] / epsilon));
      local_38.idx_ = _vh.idx_;
      std::
      _Hashtable<OpenMesh::VectorT<int,2>,std::pair<OpenMesh::VectorT<int,2>const,int>,std::allocator<std::pair<OpenMesh::VectorT<int,2>const,int>>,std::__detail::_Select1st,std::equal_to<OpenMesh::VectorT<int,2>>,myHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::pair<OpenMesh::VectorT<int,2>,int>>
                ((_Hashtable<OpenMesh::VectorT<int,2>,std::pair<OpenMesh::VectorT<int,2>const,int>,std::allocator<std::pair<OpenMesh::VectorT<int,2>const,int>>,std::__detail::_Select1st,std::equal_to<OpenMesh::VectorT<int,2>>,myHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                  *)&neighbors,&local_40);
    }
    _vh.idx_ = _vh.idx_ + 1;
  }
  return;
}

Assistant:

void initHashMap(const Mesh& mesh, const Eigen::VectorXd& x, double epsilon) {
    neighbors.clear();
    for (int i = 0; i < x.size(); i += 2) {
        OpenMesh::VertexHandle handle(i / 2);
        if (mesh.is_boundary(handle)) {
            OpenMesh::Vec2i idx(x[i] / epsilon, x[i + 1] / epsilon);
            neighbors.insert(std::make_pair(idx, i / 2));
        }
    }
}